

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

string * __thiscall
jsonnet::internal::jsonnet_fmt_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,AST *ast,Fodder *final_fodder,FmtOpts *opts
          )

{
  pointer pcVar1;
  _func_int **pp_Var2;
  AST *ast_local;
  Allocator alloc;
  Unparser unparser;
  stringstream ss;
  pointer pFStack_1a0;
  pointer pFStack_198;
  undefined4 local_190;
  undefined1 local_18c;
  pointer local_188;
  pointer pFStack_180;
  pointer local_178;
  
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  alloc.allocated.
  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&alloc.allocated;
  alloc.allocated.
  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
  _M_node._M_size = 0;
  ast_local = (AST *)this;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  alloc.allocated.
  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       alloc.allocated.
       super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl
       ._M_node.super__List_node_base._M_next;
  if (*(char *)((long)&(final_fodder->
                       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       )._M_impl.super__Vector_impl_data._M_end_of_storage + 2) == '\x01') {
    _ss = (undefined **)&alloc;
    SortImports::file((SortImports *)&ss,&ast_local);
  }
  remove_initial_newlines(ast_local);
  if (*(int *)&(final_fodder->
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               )._M_impl.super__Vector_impl_data._M_finish != 0) {
    pFStack_1a0 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    pFStack_198 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_190 = *(undefined4 *)
                 &(final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
    _ss = &PTR_fodderElement_0022fbe0;
    CompilerPass::file((CompilerPass *)&ss,&ast_local,(Fodder *)ast);
  }
  pFStack_1a0 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pFStack_198 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  local_190 = *(undefined4 *)
               &(final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  _ss = &PTR_fodderElement_0022fd58;
  CompilerPass::file((CompilerPass *)&ss,&ast_local,(Fodder *)ast);
  pFStack_1a0 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pFStack_198 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  local_190 = *(undefined4 *)
               &(final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  _ss = &PTR_fodderElement_0022feb8;
  local_188 = (pointer)0x0;
  pFStack_180 = (pointer)0x0;
  local_178 = (pointer)0x0;
  CompilerPass::file((CompilerPass *)&ss,&ast_local,(Fodder *)ast);
  FixTrailingCommas::~FixTrailingCommas((FixTrailingCommas *)&ss);
  pFStack_1a0 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pFStack_198 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  local_190 = *(undefined4 *)
               &(final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  _ss = &PTR_fodderElement_00230018;
  CompilerPass::file((CompilerPass *)&ss,&ast_local,(Fodder *)ast);
  pFStack_1a0 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pFStack_198 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  local_190 = *(undefined4 *)
               &(final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  _ss = &PTR_fodderElement_00230178;
  CompilerPass::file((CompilerPass *)&ss,&ast_local,(Fodder *)ast);
  pFStack_1a0 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pFStack_198 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  local_190 = *(undefined4 *)
               &(final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  _ss = &PTR_fodderElement_002302d8;
  CompilerPass::file((CompilerPass *)&ss,&ast_local,(Fodder *)ast);
  if (*(char *)((long)&(final_fodder->
                       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       )._M_impl.super__Vector_impl_data._M_finish + 6) == '\x01') {
    pFStack_1a0 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    pFStack_198 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_190 = *(undefined4 *)
                 &(final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
    _ss = &PTR_fodderElement_00230438;
    CompilerPass::file((CompilerPass *)&ss,&ast_local,(Fodder *)ast);
  }
  else if (*(char *)((long)&(final_fodder->
                            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            )._M_impl.super__Vector_impl_data._M_finish + 7) == '\x01') {
    pFStack_1a0 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    pFStack_198 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_190 = *(undefined4 *)
                 &(final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
    _ss = &PTR_fodderElement_00230598;
    local_188 = (pointer)0x0;
    pFStack_180 = (pointer)0x0;
    local_178 = (pointer)0x0;
    StripAllButComments::file((StripAllButComments *)&ss,&ast_local,(Fodder *)ast);
    StripAllButComments::~StripAllButComments((StripAllButComments *)&ss);
  }
  else if (*(char *)&(final_fodder->
                     super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     )._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
    pFStack_1a0 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    pFStack_198 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_190 = *(undefined4 *)
                 &(final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
    _ss = &PTR_fodderElement_002306f8;
    CompilerPass::file((CompilerPass *)&ss,&ast_local,(Fodder *)ast);
  }
  if (*(char *)((long)&(final_fodder->
                       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       )._M_impl.super__Vector_impl_data._M_end_of_storage + 1) == '\x01') {
    pFStack_1a0 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    pFStack_198 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_190 = *(undefined4 *)
                 &(final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
    _ss = &PTR_fodderElement_00230858;
    CompilerPass::file((CompilerPass *)&ss,&ast_local,(Fodder *)ast);
  }
  if (*(char *)&(final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_start != 'l') {
    pFStack_1a0 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    pFStack_198 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_190 = *(undefined4 *)
                 &(final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
    _ss = &PTR_fodderElement_002309b8;
    CompilerPass::file((CompilerPass *)&ss,&ast_local,(Fodder *)ast);
  }
  if (*(char *)((long)&(final_fodder->
                       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1) != 'l') {
    pFStack_1a0 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    pFStack_198 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_190 = *(undefined4 *)
                 &(final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
    _ss = &PTR_fodderElement_00230b18;
    local_18c = 1;
    CompilerPass::file((CompilerPass *)&ss,&ast_local,(Fodder *)ast);
  }
  if (*(int *)((long)&(final_fodder->
                      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                      )._M_impl.super__Vector_impl_data._M_start + 4) != 0) {
    _ss = &PTR_file_00230c78;
    pFStack_1a0 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    pFStack_198 = (pointer)(ulong)*(uint *)&(final_fodder->
                                            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                            )._M_impl.super__Vector_impl_data._M_end_of_storage;
    FixIndentation::file((FixIndentation *)&ss,ast_local,(Fodder *)ast);
  }
  pp_Var2 = (_func_int **)(ast->location).file._M_dataplus._M_p;
  if (ast->_vptr_AST != pp_Var2) {
    pcVar1 = (pointer)((long)pp_Var2 + -0x24);
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  unparser.opts._0_8_ =
       (final_fodder->
       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
       )._M_impl.super__Vector_impl_data._M_start;
  unparser.opts._8_8_ =
       (final_fodder->
       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  unparser.opts._16_4_ =
       *(undefined4 *)
        &(final_fodder->
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
  unparser.o = (ostream *)&pFStack_1a0;
  Unparser::unparse(&unparser,ast_local,false);
  Unparser::fill_final(&unparser,(Fodder *)ast,true,false);
  pp_Var2 = (_func_int **)(ast->location).file._M_dataplus._M_p;
  if ((ast->_vptr_AST == pp_Var2) || (*(int *)(pp_Var2 + -5) == 1)) {
    std::operator<<((ostream *)&pFStack_1a0,"\n");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  Allocator::~Allocator(&alloc);
  return __return_storage_ptr__;
}

Assistant:

std::string jsonnet_fmt(AST *ast, Fodder &final_fodder, const FmtOpts &opts)
{
    Allocator alloc;

    // Passes to enforce style on the AST.
    if (opts.sortImports)
        SortImports(alloc).file(ast);
    remove_initial_newlines(ast);
    if (opts.maxBlankLines > 0)
        EnforceMaximumBlankLines(alloc, opts).file(ast, final_fodder);
    FixNewlines(alloc, opts).file(ast, final_fodder);
    FixTrailingCommas(alloc, opts).file(ast, final_fodder);
    FixParens(alloc, opts).file(ast, final_fodder);
    FixPlusObject(alloc, opts).file(ast, final_fodder);
    NoRedundantSliceColon(alloc, opts).file(ast, final_fodder);
    if (opts.stripComments)
        StripComments(alloc, opts).file(ast, final_fodder);
    else if (opts.stripAllButComments)
        StripAllButComments(alloc, opts).file(ast, final_fodder);
    else if (opts.stripEverything)
        StripEverything(alloc, opts).file(ast, final_fodder);
    if (opts.prettyFieldNames)
        PrettyFieldNames(alloc, opts).file(ast, final_fodder);
    if (opts.stringStyle != 'l')
        EnforceStringStyle(alloc, opts).file(ast, final_fodder);
    if (opts.commentStyle != 'l')
        EnforceCommentStyle(alloc, opts).file(ast, final_fodder);
    if (opts.indent > 0)
        FixIndentation(opts).file(ast, final_fodder);
    remove_extra_trailing_newlines(final_fodder);

    std::stringstream ss;
    Unparser unparser(ss, opts);
    unparser.unparse(ast, false);
    unparser.fill_final(final_fodder, true, false);
    if (final_fodder.empty() || final_fodder.back().kind == FodderElement::INTERSTITIAL) {
        ss << "\n";
    }
    return ss.str();
}